

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_ALSA.c
# Opt level: O0

UINT8 ALSA_Stop(void *drvObj)

{
  int iVar1;
  int retVal;
  DRV_ALSA *drv;
  void *drvObj_local;
  
  if (*(char *)((long)drvObj + 8) == '\x01') {
    *(undefined1 *)((long)drvObj + 8) = 2;
    OSThread_Join(*(OS_THREAD **)((long)drvObj + 0x30));
    OSThread_Deinit(*(OS_THREAD **)((long)drvObj + 0x30));
    *(undefined8 *)((long)drvObj + 0x30) = 0;
    if (*(char *)((long)drvObj + 0x51) != '\0') {
      snd_pcm_pause(*(undefined8 *)((long)drvObj + 0x48),0);
    }
    snd_pcm_drain(*(undefined8 *)((long)drvObj + 0x48));
    free(*(void **)((long)drvObj + 0x28));
    *(undefined8 *)((long)drvObj + 0x28) = 0;
    iVar1 = snd_pcm_close(*(undefined8 *)((long)drvObj + 0x48));
    if (iVar1 < 0) {
      drvObj_local._7_1_ = 0xc4;
    }
    else {
      *(undefined8 *)((long)drvObj + 0x48) = 0;
      *(undefined1 *)((long)drvObj + 8) = 0;
      drvObj_local._7_1_ = '\0';
    }
  }
  else {
    drvObj_local._7_1_ = 0xd8;
  }
  return drvObj_local._7_1_;
}

Assistant:

UINT8 ALSA_Stop(void* drvObj)
{
	DRV_ALSA* drv = (DRV_ALSA*)drvObj;
	int retVal;
	
	if (drv->devState != 1)
		return 0xD8;	// is already stopped (or stopping)
	
	drv->devState = 2;
	
	OSThread_Join(drv->hThread);
	OSThread_Deinit(drv->hThread);	drv->hThread = NULL;
	
	if (drv->canPause)
		retVal = snd_pcm_pause(drv->hPCM, 0);
	retVal = snd_pcm_drain(drv->hPCM);
	
	free(drv->bufSpace);	drv->bufSpace = NULL;
	
	retVal = snd_pcm_close(drv->hPCM);
	if (retVal < 0)
		return 0xC4;		// close failed -- but why ???
	drv->hPCM = NULL;
	
	drv->devState = 0;
	
	return AERR_OK;
}